

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txfm_common_avx2.h
# Opt level: O2

void round_shift_array_32_avx2(__m256i *input,__m256i *output,int size,int bit)

{
  byte bVar1;
  undefined1 auVar2 [32];
  int iVar3;
  ulong uVar4;
  long lVar5;
  undefined1 auVar6 [32];
  
  if (size < 1) {
    for (lVar5 = 0; lVar5 != 0x400; lVar5 = lVar5 + 0x20) {
      auVar6 = vpslld_avx2(*(undefined1 (*) [32])((long)*input + lVar5),ZEXT416((uint)-size));
      *(undefined1 (*) [32])((long)*output + lVar5) = auVar6;
    }
  }
  else {
    bVar1 = (char)size - 1U & 0x1f;
    iVar3 = 1 << bVar1;
    auVar6._4_4_ = iVar3;
    auVar6._0_4_ = iVar3;
    auVar6._8_4_ = iVar3;
    auVar6._12_4_ = iVar3;
    auVar6._16_4_ = iVar3;
    auVar6._20_4_ = iVar3;
    auVar6._24_4_ = iVar3;
    auVar6._28_4_ = iVar3;
    for (uVar4 = (ulong)(uint)(0 << bVar1); uVar4 != 0x400; uVar4 = uVar4 + 0x20) {
      auVar2 = vpaddd_avx2(auVar6,*(undefined1 (*) [32])((long)*input + uVar4));
      auVar2 = vpsrad_avx2(auVar2,ZEXT416((uint)size));
      *(undefined1 (*) [32])((long)*output + uVar4) = auVar2;
    }
  }
  return;
}

Assistant:

static inline void round_shift_array_32_avx2(__m256i *input, __m256i *output,
                                             const int size, const int bit) {
  if (bit > 0) {
    int i;
    for (i = 0; i < size; i++) {
      output[i] = round_shift_32_avx2(input[i], bit);
    }
  } else {
    int i;
    for (i = 0; i < size; i++) {
      output[i] = _mm256_slli_epi32(input[i], -bit);
    }
  }
}